

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertInclude(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  cmTargetInternals *this_00;
  const_iterator __position;
  
  this_00 = (this->Internal).Pointer;
  __position._M_current =
       (&(this_00->IncludeDirectoriesBacktraces).
         super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
         super__Vector_impl_data._M_start)[!before];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this_00->IncludeDirectoriesEntries,
           (&(this_00->IncludeDirectoriesEntries).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)[!before],entry);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,__position,bt);
  return;
}

Assistant:

void cmTarget::InsertInclude(std::string const& entry,
                             cmListFileBacktrace const& bt,
                             bool before)
{
  std::vector<std::string>::iterator position =
      before ? this->Internal->IncludeDirectoriesEntries.begin()
             : this->Internal->IncludeDirectoriesEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition =
      before ? this->Internal->IncludeDirectoriesBacktraces.begin()
             : this->Internal->IncludeDirectoriesBacktraces.end();

  this->Internal->IncludeDirectoriesEntries.insert(position, entry);
  this->Internal->IncludeDirectoriesBacktraces.insert(btPosition, bt);
}